

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

size_type __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeValue>::size
          (File<hta::storage::file::Metric::Header,_hta::TimeValue> *this)

{
  streamoff sVar1;
  streamoff sVar2;
  fpos local_28 [16];
  ulong local_18;
  ssize_t size_bytes;
  File<hta::storage::file::Metric::Header,_hta::TimeValue> *this_local;
  
  size_bytes = (ssize_t)this;
  std::istream::seekg((long)&this->stream_,_S_beg);
  check_stream(this,"seekg to end for size");
  local_28 = (fpos  [16])std::istream::tellg();
  sVar1 = std::fpos::operator_cast_to_long(local_28);
  sVar2 = std::fpos::operator_cast_to_long((fpos *)&this->data_begin_);
  local_18 = sVar1 - sVar2;
  if (-1 < (long)local_18) {
    return local_18 >> 4;
  }
  __assert_fail("size_bytes >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/file.hpp"
                ,0xd1,
                "size_type hta::storage::file::File<hta::storage::file::Metric::Header, hta::TimeValue>::size() [HeaderType = hta::storage::file::Metric::Header, T = hta::TimeValue]"
               );
}

Assistant:

size_type size()
    {
        stream_.seekg(0, std::fstream::end);
        check_stream("seekg to end for size");
        auto size_bytes = ssize_t(stream_.tellg()) - ssize_t(data_begin_);
        assert(size_bytes >= 0);
        // A file that is written in the background may have incomple records
        // during flush. It is useful to allow reading such a file.
        // assert(0 == size_bytes % value_size);
        return size_bytes / value_size;
    }